

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O1

sc_signed * sc_dt::operator+(sc_signed *__return_storage_ptr__,sc_signed *u,sc_unsigned *v)

{
  if (u->sgn == 0) {
    sc_signed::sc_signed(__return_storage_ptr__,v);
  }
  else if (v->sgn == 0) {
    sc_signed::sc_signed(__return_storage_ptr__,u);
  }
  else {
    add_signed_friend(__return_storage_ptr__,u->sgn,u->nbits,u->ndigits,u->digit,v->sgn,v->nbits,
                      v->ndigits,v->digit);
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator+(const sc_signed& u, const sc_unsigned& v)
{

  if (u.sgn == SC_ZERO) // case 1
    return sc_signed(v);

  if (v.sgn == SC_ZERO) // case 2
    return sc_signed(u);

  // cases 3 and 4
  return add_signed_friend(u.sgn, u.nbits, u.ndigits, u.digit,
                           v.sgn, v.nbits, v.ndigits, v.digit);

}